

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O2

void EbGb(PDISASM pMyDisasm)

{
  (pMyDisasm->Reserved_).OperandSize = 8;
  (pMyDisasm->Reserved_).MemDecoration = 1;
  ExGx(pMyDisasm);
  (pMyDisasm->Reserved_).OperandSize = 0x20;
  if (((pMyDisasm->Reserved_).MOD_ == 3) && ((pMyDisasm->Prefix).LockPrefix == '\x01')) {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  return;
}

Assistant:

void __bea_callspec__ EbGb(PDISASM pMyDisasm)
{
  GV.MemDecoration = Arg1byte;
  GV.OperandSize = 8;
  ExGx(pMyDisasm);
  GV.OperandSize = 32;
  if (
      (GV.MOD_ == 3) &&
      (pMyDisasm->Prefix.LockPrefix == InUsePrefix)
    ) {
    GV.ERROR_OPCODE = UD_;
  }
}